

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.c
# Opt level: O1

void resize_menu(gamewin *gw)

{
  int iVar1;
  _func_void_gamewin_ptr *p_Var2;
  
  layout_menu(gw);
  iVar1 = *(int *)&gw[1].prev - *(int *)((long)&gw[2].resize + 4);
  if (iVar1 < *(int *)&gw[2].draw) {
    *(int *)&gw[2].draw = iVar1;
  }
  delwin(gw[1].draw);
  wresize(gw->win,*(undefined4 *)((long)&gw[2].draw + 4),*(undefined4 *)&gw[2].win);
  p_Var2 = (_func_void_gamewin_ptr *)
           derwin(gw->win,*(undefined4 *)((long)&gw[2].resize + 4),
                  *(undefined4 *)((long)&gw[2].win + 4),*(int *)&gw[2].resize + -1,2);
  gw[1].draw = p_Var2;
  mvwin(gw->win,(_LINES - *(int *)((long)&gw[2].draw + 4)) / 2,(_COLS - *(int *)&gw[2].win) / 2);
  draw_menu(gw);
  return;
}

Assistant:

static void resize_menu(struct gamewin *gw)
{
    struct win_menu *mdat = (struct win_menu*)gw->extra;
    int startx, starty;
    
    layout_menu(gw);
    /* if the window got longer and the last line was already visible, draw_menu
     * would go past the end of mdat->items without this */
    if (mdat->offset > mdat->icount - mdat->innerheight)
	mdat->offset = mdat->icount - mdat->innerheight;

    delwin(mdat->content);
    wresize(gw->win, mdat->height, mdat->width);
    mdat->content = derwin(gw->win, mdat->innerheight, mdat->innerwidth,
			   mdat->frameheight-1, 2);
    
    starty = (LINES - mdat->height) / 2;
    startx = (COLS - mdat->width) / 2;
    
    mvwin(gw->win, starty, startx);
    
    draw_menu(gw);
}